

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void mcbsp_qsize(mcbsp_nprocs_t *packets,mcbsp_size_t *total_size)

{
  Bsmp *pBVar1;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_qsize: can only be called within SPMD section\n");
  }
  if (packets == (mcbsp_nprocs_t *)0x0 || total_size == (mcbsp_size_t *)0x0) {
    bsp_abort("bsp_qsize: both arguments may not be NULL\n");
  }
  if (s_bsmp->m_total_n_messages >> 0x20 != 0) {
    bsp_abort("bsp_qsize: Integer overflow while querying number of messages in queue. There are %zu messages while the data type allows only %zu\n"
              ,s_bsmp->m_total_n_messages,0xffffffff);
  }
  pBVar1 = s_bsmp;
  *packets = (mcbsp_nprocs_t)s_bsmp->m_total_n_messages;
  *total_size = pBVar1->m_total_payload;
  return;
}

Assistant:

void mcbsp_qsize( mcbsp_nprocs_t * packets, 
                             mcbsp_size_t * total_size )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_qsize: can only be called within SPMD section\n");

    if ( packets == NULL || total_size == NULL )
        bsp_abort("bsp_qsize: both arguments may not be NULL\n");

    size_t mcbsp_p_max = std::numeric_limits<mcbsp_nprocs_t>::max();
    size_t mcbsp_size_max = std::numeric_limits<mcbsp_size_t>::max();
    if ( s_bsmp->n_total_messages() > mcbsp_p_max )
        bsp_abort("bsp_qsize: Integer overflow while querying number of "
                "messages in queue. There are %zu messages while the data"
                " type allows only %zu\n", s_bsmp->n_total_messages(),
                mcbsp_p_max );

   if ( s_bsmp->total_payload() > mcbsp_size_max )
        bsp_abort("bsp_qsize: Integer overflow while querying total amount of "
                "payload in queue. The total payload size is %zu  while the data"
                " type allows only %zu\n", s_bsmp->total_payload(),
                mcbsp_size_max );

   * packets = static_cast<mcbsp_nprocs_t>( s_bsmp->n_total_messages() );
   * total_size = static_cast<mcbsp_size_t>( s_bsmp->total_payload() );
}